

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_train.cc
# Opt level: O2

int main(int argc,char **argv)

{
  vw *vw;
  ostream *poVar1;
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"--hash all -q st --noconstant -f train.w --quiet --csoaa_ldf m",
             &local_29);
  vw = VW::initialize(&local_28,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  run(vw);
  poVar1 = std::operator<<((ostream *)&std::cerr,"ezexample_train finish");
  std::endl<char,std::char_traits<char>>(poVar1);
  VW::finish(vw,true);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{ // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE -- THIS WILL STORE A MODEL TO train.ezw
  vw* vw = VW::initialize("--hash all -q st --noconstant -f train.w --quiet --csoaa_ldf m");

  run(vw);

  // AND FINISH UP
  cerr << "ezexample_train finish"<<endl;
  VW::finish(*vw);
}